

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_maybe_do_deferred_work(tsdn_t *tsdn,arena_t *arena,decay_t *decay,size_t npages_new)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pthread_mutex_t *__mutex;
  _Bool _Var3;
  int iVar4;
  uint64_t uVar5;
  ulong uVar6;
  background_thread_info_t *pbVar7;
  nstime_t *remaining_sleep_00;
  pthread_mutex_t *__mutex_00;
  mutex_prof_data_t *data;
  nstime_t remaining_sleep;
  nstime_t nStack_38;
  
  pbVar7 = duckdb_je_background_thread_info;
  remaining_sleep_00 = &nStack_38;
  uVar6 = (ulong)arena->ind % duckdb_je_max_background_threads;
  __mutex_00 = (pthread_mutex_t *)
               ((long)&duckdb_je_background_thread_info[uVar6].mtx.field_0 + 0x48);
  iVar4 = pthread_mutex_trylock(__mutex_00);
  if (iVar4 != 0) {
    return;
  }
  pbVar7 = pbVar7 + uVar6;
  puVar1 = &(pbVar7->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((pbVar7->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pbVar7->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(pbVar7->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  _Var3 = duckdb_je_background_thread_is_started(pbVar7);
  if (!_Var3) goto LAB_0117cb20;
  if (((pbVar7->indefinite_sleep).repr & 1U) == 0) {
    __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48);
    iVar4 = pthread_mutex_trylock(__mutex);
    if (iVar4 != 0) goto LAB_0117cb20;
    puVar1 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    if (0 < (decay->time_ms).repr) {
      uVar5 = duckdb_je_nstime_ns(&pbVar7->next_wakeup);
      duckdb_je_nstime_init(&nStack_38,uVar5);
      iVar4 = duckdb_je_nstime_compare(&nStack_38,&decay->epoch);
      if (0 < iVar4) {
        duckdb_je_nstime_subtract(&nStack_38,&decay->epoch);
        if (npages_new != 0) {
          uVar5 = duckdb_je_decay_npages_purge_in(decay,&nStack_38,npages_new);
          pbVar7->npages_to_purge_new = pbVar7->npages_to_purge_new + uVar5;
        }
        (decay->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        if (pbVar7->npages_to_purge_new < 0x401) goto LAB_0117cb20;
        pbVar7->npages_to_purge_new = 0;
        goto LAB_0117ca54;
      }
    }
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  else {
    remaining_sleep_00 = (nstime_t *)0x0;
LAB_0117ca54:
    duckdb_je_background_thread_wakeup_early(pbVar7,remaining_sleep_00);
  }
LAB_0117cb20:
  (pbVar7->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex_00);
  return;
}

Assistant:

static void
arena_maybe_do_deferred_work(tsdn_t *tsdn, arena_t *arena, decay_t *decay,
    size_t npages_new) {
	background_thread_info_t *info = arena_background_thread_info_get(
	    arena);
	if (malloc_mutex_trylock(tsdn, &info->mtx)) {
		/*
		 * Background thread may hold the mutex for a long period of
		 * time.  We'd like to avoid the variance on application
		 * threads.  So keep this non-blocking, and leave the work to a
		 * future epoch.
		 */
		return;
	}
	if (!background_thread_is_started(info)) {
		goto label_done;
	}

	nstime_t remaining_sleep;
	if (background_thread_indefinite_sleep(info)) {
		background_thread_wakeup_early(info, NULL);
	} else if (arena_should_decay_early(tsdn, arena, decay, info,
	    &remaining_sleep, npages_new)) {
		info->npages_to_purge_new = 0;
		background_thread_wakeup_early(info, &remaining_sleep);
	}
label_done:
	malloc_mutex_unlock(tsdn, &info->mtx);
}